

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
::erase(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
        *this,iterator it)

{
  AssertNotDebugCapacity(this);
  AssertIsFull(it.ctrl_,'\0',(GenerationType *)0x0,"erase()");
  destroy(this,it.field_1.slot_);
  erase_meta_only(this,(const_iterator)it);
  return;
}

Assistant:

void erase(iterator it) {
    AssertNotDebugCapacity();
    AssertIsFull(it.control(), it.generation(), it.generation_ptr(), "erase()");
    destroy(it.slot());
    if (is_soo()) {
      common().set_empty_soo();
    } else {
      erase_meta_only(it);
    }
  }